

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

bool __thiscall slang::syntax::SyntaxNode::isEquivalentTo(SyntaxNode *this,SyntaxNode *other)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  SyntaxNode *this_00;
  SyntaxNode *other_00;
  size_t i;
  bool bVar4;
  string_view __x;
  string_view __y;
  Token lt;
  Token rt;
  Token local_50;
  Token local_40;
  
  sVar2 = getChildCount(this);
  if ((this->kind == other->kind) && (sVar3 = getChildCount(other), sVar2 == sVar3)) {
    for (sVar3 = 0; bVar4 = sVar2 == sVar3, !bVar4; sVar3 = sVar3 + 1) {
      this_00 = childNode(this,sVar3);
      other_00 = childNode(other,sVar3);
      if ((this_00 != (SyntaxNode *)0x0) == (other_00 == (SyntaxNode *)0x0)) {
        return bVar4;
      }
      if (this_00 == (SyntaxNode *)0x0) {
        local_50 = childToken(this,sVar3);
        local_40 = childToken(other,sVar3);
        if ((local_40.info != (Info *)0x0) != (local_50.info != (Info *)0x0)) goto LAB_001a2ed4;
        if (local_50.info != (Info *)0x0) {
          if (local_50.kind != local_40.kind) goto LAB_001a2ed4;
          __x = parsing::Token::valueText(&local_50);
          __y = parsing::Token::valueText(&local_40);
          bVar4 = std::operator==(__x,__y);
          if (!bVar4) goto LAB_001a2ed4;
        }
      }
      else {
        bVar1 = isEquivalentTo(this_00,other_00);
        if (!bVar1) {
          return bVar4;
        }
      }
    }
  }
  else {
LAB_001a2ed4:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SyntaxNode::isEquivalentTo(const SyntaxNode& other) const {
    size_t childCount = getChildCount();
    if (kind != other.kind || childCount != other.getChildCount())
        return false;

    for (size_t i = 0; i < childCount; i++) {
        auto ln = childNode(i);
        auto rn = other.childNode(i);
        if (bool(ln) != bool(rn))
            return false;

        if (ln) {
            if (!ln->isEquivalentTo(*rn))
                return false;
        }
        else {
            Token lt = childToken(i);
            Token rt = other.childToken(i);
            if (bool(lt) != bool(rt))
                return false;

            if (lt) {
                if (lt.kind != rt.kind || lt.valueText() != rt.valueText())
                    return false;
            }
        }
    }
    return true;
}